

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmgen_opna.cpp
# Opt level: O0

void __thiscall FM::OPN::Reset(OPN *this)

{
  uint local_14;
  int i;
  OPN *this_local;
  
  for (local_14 = 0x20; (int)local_14 < 0x28; local_14 = local_14 + 1) {
    SetReg(this,local_14,0);
  }
  for (local_14 = 0x30; (int)local_14 < 0xc0; local_14 = local_14 + 1) {
    SetReg(this,local_14,0);
  }
  OPNBase::Reset(&this->super_OPNBase);
  Channel4::Reset((Channel4 *)&this->field_0x1d8);
  Channel4::Reset((Channel4 *)&this->field_0x4b8);
  Channel4::Reset((Channel4 *)&this->field_0x798);
  return;
}

Assistant:

void OPN::Reset()
{
	int i;
	for (i=0x20; i<0x28; i++) SetReg(i, 0);
	for (i=0x30; i<0xc0; i++) SetReg(i, 0);
	OPNBase::Reset();
	ch[0].Reset();
	ch[1].Reset();
	ch[2].Reset();
}